

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_add_option(cargo_t ctx,cargo_option_flags_t flags,char *optnames,char *description,
                    char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [40];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list ap;
  int ret;
  char *fmt_local;
  char *description_local;
  char *optnames_local;
  cargo_option_flags_t flags_local;
  cargo_t ctx_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_e0 = in_R9;
  if (ctx != (cargo_t)0x0) {
    ap[0].overflow_arg_area = local_108;
    ap[0]._0_8_ = &stack0x00000008;
    local_58._4_4_ = 0x30;
    local_58._0_4_ = 0x28;
    iVar1 = cargo_add_optionv(ctx,flags,optnames,description,fmt,(__va_list_tag *)local_58);
    return iVar1;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x18f7,
                "int cargo_add_option(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, ...)"
               );
}

Assistant:

int cargo_add_option(cargo_t ctx, cargo_option_flags_t flags,
                        const char *optnames, const char *description,
                        const char *fmt, ...)
{
    int ret;
    va_list ap;
    assert(ctx);

    va_start(ap, fmt);
    ret = cargo_add_optionv(ctx, flags, optnames, description, fmt, ap);
    va_end(ap);

    return ret;
}